

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O3

void __thiscall Assimp::ASEImporter::BuildLights(ASEImporter *this)

{
  undefined8 uVar1;
  int iVar2;
  pointer pLVar3;
  pointer pLVar4;
  ulong __n;
  aiLight **ppaVar5;
  aiLight *paVar6;
  ulong uVar7;
  long lVar8;
  aiScene *paVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pLVar3 = (this->mParser->m_vLights).
           super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar4 = (this->mParser->m_vLights).
           super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar3 != pLVar4) {
    this->pcScene->mNumLights = (int)((ulong)((long)pLVar4 - (long)pLVar3) >> 4) * -0x1642c859;
    paVar9 = this->pcScene;
    ppaVar5 = (aiLight **)operator_new__((ulong)paVar9->mNumLights << 3);
    paVar9->mLights = ppaVar5;
    paVar9 = this->pcScene;
    if (paVar9->mNumLights != 0) {
      lVar8 = 0x16c;
      uVar7 = 0;
      do {
        paVar6 = (aiLight *)operator_new(0x46c);
        (paVar6->mName).length = 0;
        (paVar6->mName).data[0] = '\0';
        memset((paVar6->mName).data + 1,0x1b,0x3ff);
        paVar6->mType = aiLightSource_UNDEFINED;
        (paVar6->mPosition).x = 0.0;
        (paVar6->mPosition).y = 0.0;
        (paVar6->mPosition).z = 0.0;
        (paVar6->mDirection).x = 0.0;
        (paVar6->mDirection).y = 0.0;
        *(undefined8 *)&(paVar6->mDirection).z = 0;
        (paVar6->mUp).x = 0.0;
        (paVar6->mUp).y = 0.0;
        *(undefined8 *)&(paVar6->mUp).z = 0;
        paVar6->mAttenuationLinear = 1.0;
        paVar6->mAttenuationQuadratic = 0.0;
        (paVar6->mColorDiffuse).r = 0.0;
        (paVar6->mColorDiffuse).g = 0.0;
        (paVar6->mColorDiffuse).b = 0.0;
        (paVar6->mColorSpecular).r = 0.0;
        (paVar6->mColorSpecular).g = 0.0;
        *(undefined8 *)&(paVar6->mColorSpecular).b = 0;
        (paVar6->mColorAmbient).g = 0.0;
        (paVar6->mColorAmbient).b = 0.0;
        paVar6->mAngleInnerCone = 6.2831855;
        paVar6->mAngleOuterCone = 6.2831855;
        (paVar6->mSize).x = 0.0;
        (paVar6->mSize).y = 0.0;
        paVar9->mLights[uVar7] = paVar6;
        pLVar3 = (this->mParser->m_vLights).
                 super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>._M_impl
                 .super__Vector_impl_data._M_start;
        (paVar6->mDirection).x = 0.0;
        (paVar6->mDirection).y = 0.0;
        (paVar6->mDirection).z = -1.0;
        __n = *(ulong *)((long)pLVar3 + lVar8 + -0x15c);
        if (__n < 0x400) {
          (paVar6->mName).length = (ai_uint32)__n;
          memcpy((paVar6->mName).data,*(void **)((long)pLVar3 + lVar8 + -0x164),__n);
          (paVar6->mName).data[__n] = '\0';
        }
        iVar2 = *(int *)((long)pLVar3 + lVar8 + -0x18);
        if (iVar2 == 3) {
          paVar6->mType = aiLightSource_DIRECTIONAL;
        }
        else if (iVar2 == 1) {
          paVar6->mType = aiLightSource_SPOT;
          fVar11 = *(float *)((long)pLVar3 + lVar8 + -4) * 0.017453292;
          paVar6->mAngleInnerCone = fVar11;
          fVar12 = *(float *)((long)&(pLVar3->super_BaseNode).mType + lVar8);
          uVar10 = -(uint)(fVar12 != 0.0);
          paVar6->mAngleOuterCone =
               (float)(~uVar10 & (uint)fVar11 | (uint)(fVar12 * 0.017453292) & uVar10);
        }
        else {
          paVar6->mType = aiLightSource_POINT;
        }
        uVar1 = *(undefined8 *)((long)pLVar3 + lVar8 + -0xc);
        fVar11 = (float)((ulong)uVar1 >> 0x20);
        fVar13 = fVar11 * *(float *)((long)pLVar3 + lVar8 + -0x14);
        fVar12 = *(float *)((long)pLVar3 + lVar8 + -0x10) * fVar11;
        fVar11 = fVar11 * (float)uVar1;
        (paVar6->mColorSpecular).r = fVar13;
        (paVar6->mColorSpecular).g = fVar12;
        (paVar6->mColorSpecular).b = fVar11;
        (paVar6->mColorDiffuse).r = fVar13;
        (paVar6->mColorDiffuse).g = fVar12;
        (paVar6->mColorDiffuse).b = fVar11;
        uVar7 = uVar7 + 1;
        paVar9 = this->pcScene;
        lVar8 = lVar8 + 0x170;
      } while (uVar7 < paVar9->mNumLights);
    }
  }
  return;
}

Assistant:

void ASEImporter::BuildLights()
{
    if (!mParser->m_vLights.empty())    {
        pcScene->mNumLights = (unsigned int)mParser->m_vLights.size();
        pcScene->mLights    = new aiLight*[pcScene->mNumLights];

        for (unsigned int i = 0; i < pcScene->mNumLights;++i)   {
            aiLight* out = pcScene->mLights[i] = new aiLight();
            ASE::Light& in = mParser->m_vLights[i];

            // The direction is encoded in the transformation matrix of the node.
            // In 3DS MAX the light source points into negative Z direction if
            // the node transformation is the identity.
            out->mDirection = aiVector3D(0.f,0.f,-1.f);

            out->mName.Set(in.mName);
            switch (in.mLightType)
            {
            case ASE::Light::TARGET:
                out->mType = aiLightSource_SPOT;
                out->mAngleInnerCone = AI_DEG_TO_RAD(in.mAngle);
                out->mAngleOuterCone = (in.mFalloff ? AI_DEG_TO_RAD(in.mFalloff) : out->mAngleInnerCone);
                break;

            case ASE::Light::DIRECTIONAL:
                out->mType = aiLightSource_DIRECTIONAL;
                break;

            default:
            //case ASE::Light::OMNI:
                out->mType = aiLightSource_POINT;
                break;
            };
            out->mColorDiffuse = out->mColorSpecular = in.mColor * in.mIntensity;
        }
    }
}